

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QIBusAttribute>::reallocateAndGrow
          (QArrayDataPointer<QIBusAttribute> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QIBusAttribute> *old)

{
  QArrayData *pQVar1;
  QIBusAttribute *pQVar2;
  Data *pDVar3;
  bool bVar4;
  long lVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QArrayDataPointer<QIBusAttribute> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QIBusAttribute> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar4)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar6 = 0;
        lVar5 = 0;
      }
      else {
        qVar6 = pQVar1->alloc;
        lVar5 = (this->size - pQVar1->alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
                -0x5555555555555555;
      }
      auVar7 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x30,qVar6 + n + lVar5,Grow);
      this->d = (Data *)auVar7._0_8_;
      this->ptr = (QIBusAttribute *)auVar7._8_8_;
      goto LAB_0011de7c;
    }
  }
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (QIBusAttribute *)0xaaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    if (this->d == (Data *)0x0) {
      bVar4 = true;
    }
    else {
      bVar4 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pQVar2 = this->ptr;
    if ((old != (QArrayDataPointer<QIBusAttribute> *)0x0) || (bVar4)) {
      QtPrivate::QGenericArrayOps<QIBusAttribute>::copyAppend
                ((QGenericArrayOps<QIBusAttribute> *)&local_38,pQVar2,
                 pQVar2 + (n >> 0x3f & n) + this->size);
    }
    else {
      QtPrivate::QGenericArrayOps<QIBusAttribute>::moveAppend
                ((QGenericArrayOps<QIBusAttribute> *)&local_38,pQVar2,
                 pQVar2 + (n >> 0x3f & n) + this->size);
    }
  }
  pDVar3 = this->d;
  pQVar2 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar6 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar3;
  local_38.ptr = pQVar2;
  local_38.size = qVar6;
  if (old != (QArrayDataPointer<QIBusAttribute> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar3;
    old->ptr = pQVar2;
    local_38.size = old->size;
    old->size = qVar6;
  }
  ~QArrayDataPointer(&local_38);
LAB_0011de7c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }